

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

GenericSoundEssenceDescriptor * __thiscall
ASDCP::MXF::GenericSoundEssenceDescriptor::WriteToTLVSet
          (GenericSoundEssenceDescriptor *this,TLVWriter *TLVSet)

{
  MDDEntry *pMVar1;
  MDDEntry *in_RDX;
  TLVWriter local_80;
  
  if (TLVSet[1].super_MemIOWriter.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0x5fb,
                  "virtual ASDCP::Result_t ASDCP::MXF::GenericSoundEssenceDescriptor::WriteToTLVSet(TLVWriter &)"
                 );
  }
  FileDescriptor::WriteToTLVSet(&this->super_FileDescriptor,TLVSet);
  if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                    super_KLVPacket._vptr_KLVPacket) {
    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_GenericSoundEssenceDescriptor_AudioSamplingRate);
    TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
    if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                      super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                MDD_GenericSoundEssenceDescriptor_Locked);
      TLVWriter::WriteUi8(&local_80,in_RDX,pMVar1->ul);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject
                        .super_KLVPacket._vptr_KLVPacket) {
        if (*(char *)((long)&TLVSet[4].m_Lookup + 2) == '\x01') {
          pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                    MDD_GenericSoundEssenceDescriptor_AudioRefLevel);
          TLVWriter::WriteUi8(&local_80,in_RDX,pMVar1->ul);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
          Kumu::Result_t::~Result_t((Result_t *)&local_80);
          if (*(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                       super_KLVPacket._vptr_KLVPacket < 0) {
            return this;
          }
        }
        if (*(char *)((long)&TLVSet[4].m_Lookup + 4) == '\x01') {
          pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                    MDD_GenericSoundEssenceDescriptor_ElectroSpatialFormulation);
          TLVWriter::WriteUi8(&local_80,in_RDX,pMVar1->ul);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
          Kumu::Result_t::~Result_t((Result_t *)&local_80);
          if (*(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                       super_KLVPacket._vptr_KLVPacket < 0) {
            return this;
          }
        }
        pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                  MDD_GenericSoundEssenceDescriptor_ChannelCount);
        TLVWriter::WriteUi32(&local_80,in_RDX,(ui32_t *)pMVar1);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
        Kumu::Result_t::~Result_t((Result_t *)&local_80);
        if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.
                          super_InterchangeObject.super_KLVPacket._vptr_KLVPacket) {
          pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                    MDD_GenericSoundEssenceDescriptor_QuantizationBits);
          TLVWriter::WriteUi32(&local_80,in_RDX,(ui32_t *)pMVar1);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
          Kumu::Result_t::~Result_t((Result_t *)&local_80);
          if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.
                            super_InterchangeObject.super_KLVPacket._vptr_KLVPacket) {
            if (*(char *)((long)&TLVSet[5].super_MemIOWriter.m_capacity + 1) == '\x01') {
              pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                        MDD_GenericSoundEssenceDescriptor_DialNorm);
              TLVWriter::WriteUi8(&local_80,in_RDX,pMVar1->ul);
              Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
              Kumu::Result_t::~Result_t((Result_t *)&local_80);
              if (*(int *)&(this->super_FileDescriptor).super_GenericDescriptor.
                           super_InterchangeObject.super_KLVPacket._vptr_KLVPacket < 0) {
                return this;
              }
            }
            pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                      MDD_GenericSoundEssenceDescriptor_SoundEssenceCoding);
            TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
            Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
            Kumu::Result_t::~Result_t((Result_t *)&local_80);
            if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.
                              super_InterchangeObject.super_KLVPacket._vptr_KLVPacket) {
              if (*(char *)((long)&TLVSet[5].m_ElementMap._M_t._M_impl.super__Rb_tree_header.
                                   _M_header._M_right + 1) == '\x01') {
                pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                          MDD_GenericSoundEssenceDescriptor_ReferenceAudioAlignmentLevel
                                         );
                TLVWriter::WriteUi8(&local_80,in_RDX,pMVar1->ul);
                Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                Kumu::Result_t::~Result_t((Result_t *)&local_80);
                if (*(int *)&(this->super_FileDescriptor).super_GenericDescriptor.
                             super_InterchangeObject.super_KLVPacket._vptr_KLVPacket < 0) {
                  return this;
                }
              }
              if (*(char *)&TLVSet[6].super_MemIOWriter.m_p == '\x01') {
                pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                          MDD_GenericSoundEssenceDescriptor_ReferenceImageEditRate);
                TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
                Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                Kumu::Result_t::~Result_t((Result_t *)&local_80);
              }
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
GenericSoundEssenceDescriptor::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = FileDescriptor::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(GenericSoundEssenceDescriptor, AudioSamplingRate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi8(OBJ_WRITE_ARGS(GenericSoundEssenceDescriptor, Locked));
  if ( ASDCP_SUCCESS(result)  && ! AudioRefLevel.empty() ) result = TLVSet.WriteUi8(OBJ_WRITE_ARGS_OPT(GenericSoundEssenceDescriptor, AudioRefLevel));
  if ( ASDCP_SUCCESS(result)  && ! ElectroSpatialFormulation.empty() ) result = TLVSet.WriteUi8(OBJ_WRITE_ARGS_OPT(GenericSoundEssenceDescriptor, ElectroSpatialFormulation));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi32(OBJ_WRITE_ARGS(GenericSoundEssenceDescriptor, ChannelCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi32(OBJ_WRITE_ARGS(GenericSoundEssenceDescriptor, QuantizationBits));
  if ( ASDCP_SUCCESS(result)  && ! DialNorm.empty() ) result = TLVSet.WriteUi8(OBJ_WRITE_ARGS_OPT(GenericSoundEssenceDescriptor, DialNorm));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(GenericSoundEssenceDescriptor, SoundEssenceCoding));
  if ( ASDCP_SUCCESS(result)  && ! ReferenceAudioAlignmentLevel.empty() ) result = TLVSet.WriteUi8(OBJ_WRITE_ARGS_OPT(GenericSoundEssenceDescriptor, ReferenceAudioAlignmentLevel));
  if ( ASDCP_SUCCESS(result)  && ! ReferenceImageEditRate.empty() ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(GenericSoundEssenceDescriptor, ReferenceImageEditRate));
  return result;
}